

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  int *ridx_00;
  bool bVar4;
  long lVar5;
  int j;
  int j_1;
  int local_2ec;
  int *local_2e8;
  int32_t local_2e0;
  fpclass_type local_2dc;
  int *local_2d8;
  int *local_2d0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  int *local_2b8;
  int *local_2b0;
  ulong local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_88.m_backend.exp = (eps->m_backend).exp;
  local_88.m_backend.neg = (eps->m_backend).neg;
  local_88.m_backend.fpclass = (eps->m_backend).fpclass;
  local_88.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_2c0 = vec;
  local_2b8 = idx;
  vSolveLright(this,rhs,ridx,&rn,&local_88);
  local_2c8 = this;
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    local_2e8 = (this->row).perm;
    local_2a8 = local_2a8 & 0xffffffff00000000;
    for (lVar5 = 0; lVar5 < rn; lVar5 = lVar5 + 1) {
      iVar2 = ridx[lVar5];
      local_1c8.m_backend.exp = rhs[iVar2].m_backend.exp;
      local_1c8.m_backend.neg = rhs[iVar2].m_backend.neg;
      local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar2].m_backend.data._M_elems;
      local_1c8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 4;
      local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 8;
      local_1c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_1c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 0xc;
      local_1c8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_1c8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_1c8.m_backend.fpclass = rhs[iVar2].m_backend.fpclass;
      local_1c8.m_backend.prec_elem = rhs[iVar2].m_backend.prec_elem;
      local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_218.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4)
      ;
      local_218.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6)
      ;
      local_218.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8)
      ;
      local_218.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 10);
      local_218.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
      local_218.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
      local_218.m_backend.exp = (eps->m_backend).exp;
      local_218.m_backend.neg = (eps->m_backend).neg;
      local_218.m_backend.fpclass = (eps->m_backend).fpclass;
      local_218.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1c8,&local_218);
      if (bVar4) {
        enQueueMax(ridx,(int *)&local_2a8,local_2e8[iVar2]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&rhs[iVar2].m_backend,0);
      }
    }
    rn = (int)local_2a8;
  }
  else {
    local_2d0 = forestIdx;
    local_2b0 = (this->row).perm;
    local_2ec = 0;
    local_2d8 = ridx;
    for (lVar5 = 0; lVar5 < rn; lVar5 = lVar5 + 1) {
      iVar2 = ridx[lVar5];
      local_2a8 = *(ulong *)rhs[iVar2].m_backend.data._M_elems;
      uStack_2a0 = *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 4;
      local_298 = *(undefined8 *)puVar1;
      uStack_290 = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 8;
      local_288 = *(undefined8 *)puVar1;
      uStack_280 = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 0xc;
      local_278 = *(undefined8 *)puVar1;
      uStack_270 = *(undefined8 *)(puVar1 + 2);
      iVar3 = rhs[iVar2].m_backend.exp;
      local_268.m_backend.neg = rhs[iVar2].m_backend.neg;
      local_2dc = rhs[iVar2].m_backend.fpclass;
      local_2e0 = rhs[iVar2].m_backend.prec_elem;
      local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar2].m_backend.data._M_elems;
      local_268.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 4;
      local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 8;
      local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_268.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 0xc;
      local_268.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_268.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_2e8 = (int *)CONCAT71(local_2e8._1_7_,local_268.m_backend.neg);
      local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_178.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4)
      ;
      local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6)
      ;
      local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8)
      ;
      local_178.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 10);
      local_178.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
      local_178.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
      local_178.m_backend.exp = (eps->m_backend).exp;
      local_178.m_backend.neg = (eps->m_backend).neg;
      local_178.m_backend.fpclass = (eps->m_backend).fpclass;
      local_178.m_backend.prec_elem = (eps->m_backend).prec_elem;
      local_268.m_backend.exp = iVar3;
      local_268.m_backend.fpclass = local_2dc;
      local_268.m_backend.prec_elem = local_2e0;
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_268,&local_178);
      ridx = local_2d8;
      if (bVar4) {
        *local_2d0 = iVar2;
        local_2d0 = local_2d0 + 1;
        enQueueMax(local_2d8,&local_2ec,local_2b0[iVar2]);
        puVar1 = forest[iVar2].m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar1 = local_278;
        *(undefined8 *)(puVar1 + 2) = uStack_270;
        puVar1 = forest[iVar2].m_backend.data._M_elems + 8;
        *(undefined8 *)puVar1 = local_288;
        *(undefined8 *)(puVar1 + 2) = uStack_280;
        puVar1 = forest[iVar2].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = local_298;
        *(undefined8 *)(puVar1 + 2) = uStack_290;
        *(ulong *)forest[iVar2].m_backend.data._M_elems = local_2a8;
        *(undefined8 *)(forest[iVar2].m_backend.data._M_elems + 2) = uStack_2a0;
        forest[iVar2].m_backend.exp = iVar3;
        forest[iVar2].m_backend.neg = local_2e8._0_1_;
        forest[iVar2].m_backend.fpclass = local_2dc;
        forest[iVar2].m_backend.prec_elem = local_2e0;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&rhs[iVar2].m_backend,0);
        ridx = local_2d8;
      }
    }
    *forestNum = local_2ec;
    rn = local_2ec;
  }
  ridx_00 = local_2b8;
  vec_00 = local_2c0;
  this_00 = local_2c8;
  local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_d8.m_backend.exp = (eps->m_backend).exp;
  local_d8.m_backend.neg = (eps->m_backend).neg;
  local_d8.m_backend.fpclass = (eps->m_backend).fpclass;
  local_d8.m_backend.prec_elem = (eps->m_backend).prec_elem;
  rn = vSolveUright(local_2c8,local_2c0,local_2b8,rhs,ridx,rn,&local_d8);
  if ((this_00->l).updateType == 0) {
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
    local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc)
    ;
    local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe)
    ;
    local_128.m_backend.exp = (eps->m_backend).exp;
    local_128.m_backend.neg = (eps->m_backend).neg;
    local_128.m_backend.fpclass = (eps->m_backend).fpclass;
    local_128.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rn = vSolveUpdateRight(this_00,vec_00,ridx_00,rn,&local_128);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}